

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::startCallback(Highs *this,int callback_type)

{
  HighsStatus HVar1;
  reference rVar2;
  
  HVar1 = kError;
  if ((uint)callback_type < 10) {
    if ((this->callback_).user_callback.super__Function_base._M_manager == (_Manager_type)0x0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Cannot start callback when user_callback not defined\n");
    }
    else {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&(this->callback_).active,(ulong)(uint)callback_type);
      *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
      HVar1 = kOk;
      if (callback_type == 0) {
        (this->options_).super_HighsOptionsStruct.log_options.user_callback_active = true;
        HVar1 = kOk;
      }
    }
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::startCallback(const int callback_type) {
  const bool callback_type_ok =
      callback_type >= kCallbackMin && callback_type <= kCallbackMax;
  assert(callback_type_ok);
  if (!callback_type_ok) return HighsStatus::kError;
  if (!this->callback_.user_callback) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot start callback when user_callback not defined\n");
    return HighsStatus::kError;
  }
  assert(int(this->callback_.active.size()) == kNumCallbackType);
  this->callback_.active[callback_type] = true;
  // Possibly modify the logging callback activity
  if (callback_type == kCallbackLogging)
    options_.log_options.user_callback_active = true;
  return HighsStatus::kOk;
}